

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O1

void __thiscall
cmOSXBundleGenerator::CreateFramework(cmOSXBundleGenerator *this,string *targetName,string *outpath)

{
  long *plVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pcVar6;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar8;
  bool bVar9;
  undefined8 *puVar10;
  iterator iVar11;
  undefined8 uVar12;
  string newName;
  string newoutpath;
  string frameworkVersion;
  string contentdir;
  string oldName;
  string plist;
  string name;
  string versions;
  string local_150;
  string local_130;
  string local_110;
  key_type local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined8 uStack_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  bVar9 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (!bVar9) {
    return;
  }
  if (this->MacContentFolders ==
      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __assert_fail("this->MacContentFolders",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmOSXBundleGenerator.cxx"
                  ,0x45,
                  "void cmOSXBundleGenerator::CreateFramework(const std::string &, const std::string &)"
                 );
  }
  paVar3 = &local_130.field_2;
  pcVar6 = (outpath->_M_dataplus)._M_p;
  local_130._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar6,pcVar6 + outpath->_M_string_length);
  std::__cxx11::string::append((char *)&local_130);
  cmGeneratorTarget::GetFrameworkDirectory(&local_110,this->GT,&this->ConfigName,ContentLevel);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar3) {
    uVar12 = local_130.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_110._M_string_length + local_130._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar12 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_110._M_string_length + local_130._M_string_length) goto LAB_0033cfe6;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_110,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
  }
  else {
LAB_0033cfe6:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110._M_dataplus._M_p);
  }
  local_d0 = &local_c0;
  plVar1 = puVar10 + 2;
  if ((long *)*puVar10 == plVar1) {
    local_c0 = *plVar1;
    uStack_b8 = puVar10[3];
  }
  else {
    local_c0 = *plVar1;
    local_d0 = (long *)*puVar10;
  }
  local_c8 = puVar10[1];
  *puVar10 = plVar1;
  puVar10[1] = 0;
  *(undefined1 *)plVar1 = 0;
  paVar4 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar4) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar3) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_d0);
  pcVar6 = (outpath->_M_dataplus)._M_p;
  local_110._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar6,pcVar6 + outpath->_M_string_length);
  std::__cxx11::string::append((char *)&local_110);
  cmGeneratorTarget::GetFrameworkDirectory(&local_90,this->GT,&this->ConfigName,FullLevel);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar4) {
    uVar12 = local_110.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_90._M_string_length + local_110._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar12 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_110._M_string_length <= (ulong)uVar12) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_90,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
      goto LAB_0033d14d;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_90._M_dataplus._M_p);
LAB_0033d14d:
  psVar2 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_130.field_2._M_allocated_capacity = *psVar2;
    local_130.field_2._8_8_ = puVar10[3];
    local_130._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar2;
    local_130._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_130._M_string_length = puVar10[1];
  *puVar10 = psVar2;
  puVar10[1] = 0;
  *(undefined1 *)psVar2 = 0;
  paVar3 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar4) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_(&local_110,this->GT);
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_130._M_dataplus._M_p,
             local_130._M_dataplus._M_p + local_130._M_string_length);
  bVar9 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
  if (!bVar9) {
    this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)this->MacContentFolders;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Resources","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_90);
  }
  std::__cxx11::string::append((char *)&local_90);
  cmsys::SystemTools::GetFilenameName(&local_70,targetName);
  cmLocalGenerator::GenerateFrameworkInfoPList(this->LocalGenerator,this->GT,&local_70,&local_90);
  bVar9 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
  if (!bVar9) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_d0,(undefined1 *)(local_c8 + (long)local_d0));
    std::__cxx11::string::append((char *)&local_50);
    cmsys::SystemTools::MakeDirectory(&local_50,(mode_t *)0x0);
    cmsys::SystemTools::MakeDirectory(&local_130,(mode_t *)0x0);
    std::__cxx11::string::_M_assign((string *)&local_b0);
    std::__cxx11::string::_M_assign((string *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    cmsys::SystemTools::RemoveFile(&local_150);
    cmSystemTools::CreateSymlink(&local_b0,&local_150,(string *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_150);
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x506584);
    std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
    std::__cxx11::string::_M_assign((string *)&local_150);
    std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_70._M_dataplus._M_p);
    cmsys::SystemTools::RemoveFile(&local_150);
    cmSystemTools::CreateSymlink(&local_b0,&local_150,(string *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_150);
    p_Var7 = &this->MacContentFolders->_M_t;
    paVar5 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Resources","");
    iVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(p_Var7,&local_f0);
    psVar8 = this->MacContentFolders;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar5) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar11._M_node != &(psVar8->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x506596);
      std::__cxx11::string::_M_assign((string *)&local_150);
      std::__cxx11::string::append((char *)&local_150);
      cmsys::SystemTools::RemoveFile(&local_150);
      cmSystemTools::CreateSymlink(&local_b0,&local_150,(string *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Makefile->OutputFiles,&local_150);
    }
    p_Var7 = &this->MacContentFolders->_M_t;
    local_f0._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Headers","");
    iVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(p_Var7,&local_f0);
    psVar8 = this->MacContentFolders;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar5) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar11._M_node != &(psVar8->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x5065b1);
      std::__cxx11::string::_M_assign((string *)&local_150);
      std::__cxx11::string::append((char *)&local_150);
      cmsys::SystemTools::RemoveFile(&local_150);
      cmSystemTools::CreateSymlink(&local_b0,&local_150,(string *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Makefile->OutputFiles,&local_150);
    }
    p_Var7 = &this->MacContentFolders->_M_t;
    local_f0._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"PrivateHeaders","");
    iVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(p_Var7,&local_f0);
    psVar8 = this->MacContentFolders;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar5) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar11._M_node != &(psVar8->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x5065ca);
      std::__cxx11::string::_M_assign((string *)&local_150);
      std::__cxx11::string::append((char *)&local_150);
      cmsys::SystemTools::RemoveFile(&local_150);
      cmSystemTools::CreateSymlink(&local_b0,&local_150,(string *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Makefile->OutputFiles,&local_150);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                               local_150.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar4) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateFramework(const std::string& targetName,
                                           const std::string& outpath)
{
  if (this->MustSkip()) {
    return;
  }

  assert(this->MacContentFolders);

  // Compute the location of the top-level foo.framework directory.
  std::string contentdir = outpath + "/" +
    this->GT->GetFrameworkDirectory(this->ConfigName,
                                    cmGeneratorTarget::ContentLevel);
  contentdir += "/";

  std::string newoutpath = outpath + "/" +
    this->GT->GetFrameworkDirectory(this->ConfigName,
                                    cmGeneratorTarget::FullLevel);

  std::string frameworkVersion = this->GT->GetFrameworkVersion();

  // Configure the Info.plist file
  std::string plist = newoutpath;
  if (!this->Makefile->PlatformIsAppleEmbedded()) {
    // Put the Info.plist file into the Resources directory.
    this->MacContentFolders->insert("Resources");
    plist += "/Resources";
  }
  plist += "/Info.plist";
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateFrameworkInfoPList(this->GT, name, plist);

  // Generate Versions directory only for MacOSX frameworks
  if (this->Makefile->PlatformIsAppleEmbedded()) {
    return;
  }

  // TODO: Use the cmMakefileTargetGenerator::ExtraFiles vector to
  // drive rules to create these files at build time.
  std::string oldName;
  std::string newName;

  // Make foo.framework/Versions
  std::string versions = contentdir;
  versions += "Versions";
  cmSystemTools::MakeDirectory(versions);

  // Make foo.framework/Versions/version
  cmSystemTools::MakeDirectory(newoutpath);

  // Current -> version
  oldName = frameworkVersion;
  newName = versions;
  newName += "/Current";
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // foo -> Versions/Current/foo
  oldName = "Versions/Current/";
  oldName += name;
  newName = contentdir;
  newName += name;
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // Resources -> Versions/Current/Resources
  if (this->MacContentFolders->find("Resources") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Resources";
    newName = contentdir;
    newName += "Resources";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // Headers -> Versions/Current/Headers
  if (this->MacContentFolders->find("Headers") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Headers";
    newName = contentdir;
    newName += "Headers";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // PrivateHeaders -> Versions/Current/PrivateHeaders
  if (this->MacContentFolders->find("PrivateHeaders") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/PrivateHeaders";
    newName = contentdir;
    newName += "PrivateHeaders";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }
}